

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetCurrentFont(ImFont *font)

{
  ImFontAtlas *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  
  pIVar2 = GImGui;
  GImGui->Font = font;
  fVar3 = (pIVar2->IO).FontGlobalScale * font->FontSize * font->Scale;
  fVar4 = 1.0;
  if (1.0 <= fVar3) {
    fVar4 = fVar3;
  }
  pIVar2->FontBaseSize = fVar4;
  if (pIVar2->CurrentWindow == (ImGuiWindow *)0x0) {
    fVar4 = 0.0;
  }
  else {
    fVar4 = ImGuiWindow::CalcFontSize(pIVar2->CurrentWindow);
    font = pIVar2->Font;
  }
  pIVar2->FontSize = fVar4;
  pIVar1 = font->ContainerAtlas;
  (pIVar2->DrawListSharedData).TexUvWhitePixel = pIVar1->TexUvWhitePixel;
  (pIVar2->DrawListSharedData).TexUvLines = pIVar1->TexUvLines;
  (pIVar2->DrawListSharedData).Font = font;
  (pIVar2->DrawListSharedData).FontSize = fVar4;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}